

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_conn_upkeep(Curl_easy *data,connectdata *conn,curltime *now)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  timediff_t tVar7;
  curltime newer;
  curltime older;
  CURLcode local_2c;
  uint rc;
  CURLcode result;
  curltime *now_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_2c = CURLE_OK;
  uVar1 = now->tv_sec;
  uVar2 = now->tv_usec;
  newer.tv_usec = uVar2;
  newer.tv_sec = uVar1;
  uVar3 = (conn->keepalive).tv_sec;
  uVar4 = (conn->keepalive).tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  newer._12_4_ = 0;
  older._12_4_ = 0;
  tVar7 = Curl_timediff(newer,older);
  if ((data->set).upkeep_interval_ms < tVar7) {
    Curl_attach_connection(data,conn);
    if (conn->handler->connection_check == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0) {
      local_2c = Curl_conn_keep_alive(data,conn,0);
    }
    else {
      uVar6 = (*conn->handler->connection_check)(data,conn,2);
      if ((uVar6 & 1) != 0) {
        local_2c = CURLE_RECV_ERROR;
      }
    }
    Curl_detach_connection(data);
    (conn->keepalive).tv_sec = now->tv_sec;
    uVar5 = *(undefined4 *)&now->field_0xc;
    (conn->keepalive).tv_usec = now->tv_usec;
    *(undefined4 *)&(conn->keepalive).field_0xc = uVar5;
    data_local._4_4_ = local_2c;
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_conn_upkeep(struct Curl_easy *data,
                          struct connectdata *conn,
                          struct curltime *now)
{
  CURLcode result = CURLE_OK;
  if(Curl_timediff(*now, conn->keepalive) <= data->set.upkeep_interval_ms)
    return result;

  /* briefly attach for action */
  Curl_attach_connection(data, conn);
  if(conn->handler->connection_check) {
    /* Do a protocol-specific keepalive check on the connection. */
    unsigned int rc;
    rc = conn->handler->connection_check(data, conn, CONNCHECK_KEEPALIVE);
    if(rc & CONNRESULT_DEAD)
      result = CURLE_RECV_ERROR;
  }
  else {
    /* Do the generic action on the FIRSTSOCKET filter chain */
    result = Curl_conn_keep_alive(data, conn, FIRSTSOCKET);
  }
  Curl_detach_connection(data);

  conn->keepalive = *now;
  return result;
}